

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Result * __thiscall Catch::clara::detail::ParserBase::validate(ParserBase *this)

{
  Result *in_RDI;
  
  BasicResult<void>::ok();
  return in_RDI;
}

Assistant:

virtual auto validate() const -> Result { return Result::ok(); }